

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsParser.cxx
# Opt level: O3

string * __thiscall
kws::Parser::FindNextWord_abi_cxx11_(string *__return_storage_ptr__,Parser *this,size_t pos)

{
  char cVar1;
  ulong uVar2;
  byte bVar3;
  bool bVar4;
  ulong uVar5;
  
  do {
    uVar5 = pos;
    pos = uVar5 + 1;
    if ((this->m_BufferNoComment)._M_dataplus._M_p[uVar5] == ' ') break;
  } while (uVar5 < (this->m_BufferNoComment)._M_string_length);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  uVar2 = (this->m_BufferNoComment)._M_string_length;
  if (uVar5 < uVar2) {
    bVar3 = 0;
    do {
      cVar1 = (this->m_BufferNoComment)._M_dataplus._M_p[pos - 1];
      if ((cVar1 == '\r') || (cVar1 == ' ')) {
        bVar4 = (bool)(bVar3 ^ 1);
      }
      else {
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
        uVar2 = (this->m_BufferNoComment)._M_string_length;
        bVar4 = true;
        bVar3 = 1;
      }
    } while ((pos < uVar2) && (pos = pos + 1, bVar4));
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Parser::FindNextWord(size_t pos) const
{
  size_t i=pos;

  // we go to the next space
  while(m_BufferNoComment[i] != ' ' && i<m_BufferNoComment.size())
    {
    i++;
    }

  bool inWord = true;
  bool first = false;
  std::string ivar = "";
  while(i<m_BufferNoComment.size() && inWord)
    {
    if(m_BufferNoComment[i] != ' ' && m_BufferNoComment[i] != '\r')
      {
      ivar += m_BufferNoComment[i];
      inWord = true;
      first = true;
      }
    else // we have a space
      {
      if(first)
        {
        inWord = false;
        }
      }
    i++;
    }
  return ivar;
}